

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetMacContentDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  bool bVar1;
  string local_e0;
  BundleDirectoryLevel local_bc;
  undefined1 local_b8 [4];
  BundleDirectoryLevel level;
  string local_78;
  cmAlphaNum local_58;
  undefined1 local_25;
  ArtifactType local_24;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_25 = 0;
  local_24 = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetDirectory(&local_78,this,config,artifact);
  cmAlphaNum::cmAlphaNum(&local_58,&local_78);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_b8,'/');
  cmStrCat<>(__return_storage_ptr__,&local_58,(cmAlphaNum *)local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  local_bc = ContentLevel;
  bVar1 = IsFrameworkOnApple(this);
  if (bVar1) {
    local_bc = FullLevel;
  }
  BuildBundleDirectory(&local_e0,this,__return_storage_ptr__,psStack_20,local_bc);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetMacContentDirectory(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Start with the output directory for the target.
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  BundleDirectoryLevel level = ContentLevel;
  if (this->IsFrameworkOnApple()) {
    // additional files with a framework go into the version specific
    // directory
    level = FullLevel;
  }
  fpath = this->BuildBundleDirectory(fpath, config, level);
  return fpath;
}